

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>::
ConvertToStruct(vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::ElementsPeginTxIn,_cfd::js::api::ElementsPeginTxInStruct>
               *this)

{
  pointer pEVar1;
  pointer this_00;
  ElementsPeginTxInStruct data;
  ElementsPeginTxInStruct local_160;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>).
            super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
            .
            super__Vector_base<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>).
           super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
           .
           super__Vector_base<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pEVar1) {
    do {
      js::api::json::ElementsPeginTxIn::ConvertToStruct(&local_160,this_00);
      std::
      vector<cfd::js::api::ElementsPeginTxInStruct,_std::allocator<cfd::js::api::ElementsPeginTxInStruct>_>
      ::push_back(__return_storage_ptr__,&local_160);
      js::api::ElementsPeginTxInStruct::~ElementsPeginTxInStruct(&local_160);
      this_00 = this_00 + 1;
    } while (this_00 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }